

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>&,slang::syntax::ParameterPortListSyntax*,slang::syntax::PortListSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,Token *args_3,
          SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *args_4,
          ParameterPortListSyntax **args_5,PortListSyntax **args_6,Token *args_7)

{
  Token lifetime;
  Token moduleKeyword;
  Token name;
  Token semi;
  ModuleHeaderSyntax *this_00;
  
  this_00 = (ModuleHeaderSyntax *)allocate(this,0xa0,8);
  moduleKeyword.kind = args_1->kind;
  moduleKeyword._2_1_ = args_1->field_0x2;
  moduleKeyword.numFlags.raw = (args_1->numFlags).raw;
  moduleKeyword.rawLen = args_1->rawLen;
  moduleKeyword.info = args_1->info;
  lifetime.kind = args_2->kind;
  lifetime._2_1_ = args_2->field_0x2;
  lifetime.numFlags.raw = (args_2->numFlags).raw;
  lifetime.rawLen = args_2->rawLen;
  lifetime.info = args_2->info;
  semi.kind = args_7->kind;
  semi._2_1_ = args_7->field_0x2;
  semi.numFlags.raw = (args_7->numFlags).raw;
  semi.rawLen = args_7->rawLen;
  semi.info = args_7->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax
            (this_00,*args,moduleKeyword,lifetime,name,args_4,*args_5,*args_6,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }